

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int CVodeSetLSNormFactor(void *cvode_mem,sunrealtype nrmfac)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_20;
  double local_18;
  CVodeMem local_10;
  
  local_18 = nrmfac;
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetLSNormFactor",&local_10,&local_20);
  if (iVar1 != 0) {
    return iVar1;
  }
  dVar4 = local_18;
  if (local_18 <= 0.0) {
    if (0.0 <= local_18) {
      lVar2 = N_VGetLength(local_20->ytemp);
      if (lVar2 < 1) {
        dVar4 = 0.0;
        goto LAB_00128bb5;
      }
      lVar2 = N_VGetLength(local_20->ytemp);
      dVar4 = (double)lVar2;
    }
    else {
      N_VConst(0x3ff0000000000000);
      dVar3 = (double)N_VDotProd(local_20->ytemp,local_20->ytemp);
      dVar4 = 0.0;
      if (dVar3 <= 0.0) goto LAB_00128bb5;
      dVar4 = (double)N_VDotProd(local_20->ytemp,local_20->ytemp);
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
  }
LAB_00128bb5:
  local_20->nrmfac = dVar4;
  return 0;
}

Assistant:

int CVodeSetLSNormFactor(void* cvode_mem, sunrealtype nrmfac)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  if (nrmfac > ZERO)
  {
    /* user-provided factor */
    cvls_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, cvls_mem->ytemp);
    cvls_mem->nrmfac = SUNRsqrt(N_VDotProd(cvls_mem->ytemp, cvls_mem->ytemp));
  }
  else
  {
    /* compute default factor for WRMS norm from vector length */
    cvls_mem->nrmfac = SUNRsqrt(N_VGetLength(cvls_mem->ytemp));
  }

  return (CVLS_SUCCESS);
}